

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

StringType * __thiscall
ICM::Compiler::Literal::StringType::operator+=(StringType *this,StringType *st)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *pcVar1;
  string *s;
  undefined1 local_70 [8];
  string s2;
  allocator local_39;
  undefined1 local_38 [8];
  string s1;
  StringType *st_local;
  StringType *this_local;
  
  pcVar1 = this->data;
  s1.field_2._8_8_ = st;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = *(char **)s1.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_70,pcVar1,(allocator *)((long)&s + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this->data = pcVar1;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

StringType& operator+=(const StringType& st) {
					string s1(data), s2(st.data);
					string *s = new string(s1 + s2); // TODO
					data = (char*)(s->c_str());      // TODO
					return *this;
				}